

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

QRect __thiscall QLineEditPrivate::adjustedControlRect(QLineEditPrivate *this,QRect *rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QRect QVar10;
  undefined1 auStack_48 [8];
  QPoint local_40;
  QRect local_38;
  QWidgetData *local_28;
  
  local_28 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  uVar1 = rect->x1;
  uVar3 = rect->y1;
  uVar2 = rect->x2;
  uVar4 = rect->y2;
  auVar9._0_4_ = -(uint)((int)uVar2 < (int)uVar1);
  auVar9._4_4_ = auVar9._0_4_;
  auVar9._8_4_ = -(uint)((int)uVar4 < (int)uVar3);
  auVar9._12_4_ = -(uint)((int)uVar4 < (int)uVar3);
  iVar7 = movmskpd((int)local_28,auVar9);
  if (iVar7 == 0) {
    local_38 = *rect;
  }
  else {
    local_38 = QWidget::rect(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
  }
  QVar10 = adjustedContentsRect(this);
  iVar7 = this->hscroll;
  iVar5 = this->vscroll;
  iVar6 = this->control->m_ascent;
  QWidget::fontMetrics((QWidget *)auStack_48);
  iVar8 = QFontMetrics::ascent();
  local_40.yp.m_i = iVar8 + (iVar5 - iVar6);
  local_40.xp.m_i = (QVar10.x1.m_i.m_i - iVar7) + 2;
  QVar10 = QRect::translated(&local_38,&local_40);
  QFontMetrics::~QFontMetrics((QFontMetrics *)auStack_48);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar10;
  }
  __stack_chk_fail();
}

Assistant:

QRect QLineEditPrivate::adjustedControlRect(const QRect &rect) const
{
    QRect widgetRect = !rect.isEmpty() ? rect : q_func()->rect();
    QRect cr = adjustedContentsRect();
    int cix = cr.x() - hscroll + horizontalMargin;
    return widgetRect.translated(QPoint(cix, vscroll - control->ascent() + q_func()->fontMetrics().ascent()));
}